

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestrie.h
# Opt level: O0

uint8_t * icu_63::BytesTrie::skipValue(uint8_t *pos,int32_t leadByte)

{
  uint8_t *puStack_10;
  int32_t leadByte_local;
  uint8_t *pos_local;
  
  puStack_10 = pos;
  if (0xa1 < leadByte) {
    if (leadByte < 0xd8) {
      puStack_10 = pos + 1;
    }
    else if (leadByte < 0xfc) {
      puStack_10 = pos + 2;
    }
    else {
      puStack_10 = pos + (int)((leadByte >> 1 & 1U) + 3);
    }
  }
  return puStack_10;
}

Assistant:

static inline const uint8_t *skipValue(const uint8_t *pos, int32_t leadByte) {
        // U_ASSERT(leadByte>=kMinValueLead);
        if(leadByte>=(kMinTwoByteValueLead<<1)) {
            if(leadByte<(kMinThreeByteValueLead<<1)) {
                ++pos;
            } else if(leadByte<(kFourByteValueLead<<1)) {
                pos+=2;
            } else {
                pos+=3+((leadByte>>1)&1);
            }
        }
        return pos;
    }